

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.cpp
# Opt level: O1

void __thiscall uv11::Handle::~Handle(Handle *this)

{
  _Manager_type p_Var1;
  
  this->_vptr_Handle = (_func_int **)&PTR__Handle_0010ca10;
  p_Var1 = (this->on_close).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->on_close,(_Any_data *)&this->on_close,__destroy_functor);
  }
  p_Var1 = (this->on_alloc).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->on_alloc,(_Any_data *)&this->on_alloc,__destroy_functor);
  }
  return;
}

Assistant:

Handle::~Handle() {}